

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propertyprinter.cpp
# Opt level: O0

void jsonPropertyPrinter(QList<std::pair<QString,_QString>_> *values)

{
  bool bVar1;
  pair<QString,_QString> *ppVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  pair<QString,_QString> *val;
  QList<std::pair<QString,_QString>_> *__range1;
  QJsonDocument document;
  const_iterator __end1;
  const_iterator __begin1;
  QJsonObject object;
  QList<std::pair<QString,_QString>_> *in_stack_ffffffffffffff60;
  QJsonDocument *this;
  undefined1 local_60 [24];
  undefined8 local_48;
  pair<QString,_QString> *local_40;
  const_iterator local_38;
  const_iterator local_30;
  undefined8 local_28;
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)&local_28);
  local_30.i = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
  local_30 = QList<std::pair<QString,_QString>_>::begin(in_stack_ffffffffffffff60);
  local_38.i = (pair<QString,_QString> *)0xaaaaaaaaaaaaaaaa;
  local_38 = QList<std::pair<QString,_QString>_>::end(in_stack_ffffffffffffff60);
  while( true ) {
    local_40 = local_38.i;
    bVar1 = QList<std::pair<QString,_QString>_>::const_iterator::operator!=(&local_30,local_38);
    if (!bVar1) break;
    ppVar2 = QList<std::pair<QString,_QString>_>::const_iterator::operator*(&local_30);
    QJsonValue::QJsonValue(local_20,(QString *)&ppVar2->second);
    QJsonObject::insert((QString *)&local_28,(QJsonValue *)ppVar2);
    QJsonValue::~QJsonValue(local_20);
    QList<std::pair<QString,_QString>_>::const_iterator::operator++(&local_30);
  }
  local_48 = 0xaaaaaaaaaaaaaaaa;
  this = (QJsonDocument *)&local_48;
  QJsonDocument::QJsonDocument(this,(QJsonObject *)&local_28);
  QJsonDocument::toJson(local_60,this,0);
  pcVar3 = QByteArray::constData((QByteArray *)0x339ad2);
  std::operator<<((ostream *)&std::cout,pcVar3);
  QByteArray::~QByteArray((QByteArray *)0x339aea);
  QJsonDocument::~QJsonDocument(this);
  QJsonObject::~QJsonObject((QJsonObject *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void jsonPropertyPrinter(const QList<QPair<QString, QString>> &values)
{
    QJsonObject object;
    for (const auto &val : values)
        object.insert(val.first, val.second);

    QJsonDocument document(object);
    std::cout << document.toJson().constData();
}